

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_257,_true,_embree::avx512::VirtualCurveIntersectorK<8>,_true>::
     occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  BVH *bvh;
  size_t sVar1;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined8 uVar8;
  ulong uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  byte bVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  ulong uVar22;
  char cVar23;
  byte bVar24;
  bool bVar25;
  ulong uVar26;
  ulong *puVar27;
  long lVar28;
  NodeRef root;
  uint uVar29;
  undefined1 (*pauVar30) [32];
  byte bVar31;
  undefined4 uVar32;
  byte bVar33;
  ulong uVar34;
  ulong uVar35;
  undefined1 auVar37 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar38 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  float fVar57;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 in_ZMM1 [64];
  float fVar72;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar73 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 in_ZMM4 [64];
  float fVar84;
  float fVar89;
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  vfloat4 a0;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 in_ZMM9 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [32];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  TravRayK<8,_true> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  uint local_29e4;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2980;
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [8];
  float fStack_28d8;
  float fStack_28d4;
  float fStack_28d0;
  float fStack_28cc;
  float fStack_28c8;
  undefined4 uStack_28c4;
  undefined1 local_28c0 [8];
  float fStack_28b8;
  float fStack_28b4;
  float fStack_28b0;
  float fStack_28ac;
  float fStack_28a8;
  undefined4 uStack_28a4;
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  uint local_2840;
  uint uStack_283c;
  uint uStack_2838;
  uint uStack_2834;
  uint uStack_2830;
  uint uStack_282c;
  uint uStack_2828;
  uint uStack_2824;
  uint local_2820;
  uint uStack_281c;
  uint uStack_2818;
  uint uStack_2814;
  uint uStack_2810;
  uint uStack_280c;
  uint uStack_2808;
  uint uStack_2804;
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_27c0;
  undefined1 local_27a0 [16];
  undefined1 auStack_2790 [16];
  undefined1 auStack_2780 [368];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  int iVar36;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  undefined1 auVar88 [64];
  
  bvh = (BVH *)This->ptr;
  sVar1 = (bvh->root).ptr;
  if (sVar1 != 8) {
    auVar44 = *(undefined1 (*) [32])(ray + 0x100);
    auVar40 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    uVar34 = vcmpps_avx512vl(auVar44,ZEXT1632(ZEXT816(0) << 0x40),5);
    uVar26 = vpcmpeqd_avx512vl(auVar40,(undefined1  [32])valid_i->field_0);
    uVar34 = uVar34 & uVar26;
    bVar33 = (byte)uVar34;
    if (bVar33 != 0) {
      local_2920 = *(undefined1 (*) [32])(ray + 0x80);
      local_2900 = *(undefined1 (*) [32])(ray + 0xa0);
      _local_28e0 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar88._0_4_ = local_28e0._0_4_ * local_28e0._0_4_;
      auVar88._4_4_ = local_28e0._4_4_ * local_28e0._4_4_;
      auVar88._8_4_ = local_28e0._8_4_ * local_28e0._8_4_;
      auVar88._12_4_ = local_28e0._12_4_ * local_28e0._12_4_;
      auVar88._16_4_ = local_28e0._16_4_ * local_28e0._16_4_;
      auVar88._20_4_ = local_28e0._20_4_ * local_28e0._20_4_;
      auVar88._28_36_ = in_ZMM4._28_36_;
      auVar88._24_4_ = local_28e0._24_4_ * local_28e0._24_4_;
      auVar90 = vfmadd231ps_fma(auVar88._0_32_,local_2900,local_2900);
      auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),local_2920,local_2920);
      auVar39 = vrsqrt14ps_avx512vl(ZEXT1632(auVar90));
      auVar40._8_4_ = 0xbf000000;
      auVar40._0_8_ = 0xbf000000bf000000;
      auVar40._12_4_ = 0xbf000000;
      auVar40._16_4_ = 0xbf000000;
      auVar40._20_4_ = 0xbf000000;
      auVar40._24_4_ = 0xbf000000;
      auVar40._28_4_ = 0xbf000000;
      auVar40 = vmulps_avx512vl(ZEXT1632(auVar90),auVar40);
      fVar84 = auVar39._0_4_;
      fVar89 = auVar39._4_4_;
      fVar57 = auVar39._8_4_;
      fVar64 = auVar39._12_4_;
      fVar65 = auVar39._16_4_;
      fVar66 = auVar39._20_4_;
      fVar67 = auVar39._24_4_;
      auVar90._0_4_ = fVar84 * fVar84;
      auVar90._4_4_ = fVar89 * fVar89;
      auVar90._8_4_ = fVar57 * fVar57;
      auVar90._12_4_ = fVar64 * fVar64;
      auVar42._4_4_ = auVar90._4_4_ * fVar89 * auVar40._4_4_;
      auVar42._0_4_ = auVar90._0_4_ * fVar84 * auVar40._0_4_;
      auVar42._8_4_ = auVar90._8_4_ * fVar57 * auVar40._8_4_;
      auVar42._12_4_ = auVar90._12_4_ * fVar64 * auVar40._12_4_;
      auVar42._16_4_ = fVar65 * fVar65 * fVar65 * auVar40._16_4_;
      auVar42._20_4_ = fVar66 * fVar66 * fVar66 * auVar40._20_4_;
      auVar42._24_4_ = fVar67 * fVar67 * fVar67 * auVar40._24_4_;
      auVar42._28_4_ = auVar40._28_4_;
      auVar41._8_4_ = 0x3fc00000;
      auVar41._0_8_ = 0x3fc000003fc00000;
      auVar41._12_4_ = 0x3fc00000;
      auVar41._16_4_ = 0x3fc00000;
      auVar41._20_4_ = 0x3fc00000;
      auVar41._24_4_ = 0x3fc00000;
      auVar41._28_4_ = 0x3fc00000;
      local_27c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                   vfmadd231ps_avx512vl(auVar42,auVar39,auVar41);
      auVar82._8_4_ = 0x80000000;
      auVar82._0_8_ = 0x8000000080000000;
      auVar82._12_4_ = 0x80000000;
      auVar85._12_4_ = 0;
      auVar85._0_12_ = ZEXT812(0);
      auVar85 = auVar85 << 0x20;
      auVar88 = ZEXT1264(ZEXT812(0)) << 0x20;
      auVar90 = vpcmpeqd_avx(auVar90,auVar90);
      auVar93 = ZEXT464(0x3fc00000);
      auVar94 = ZEXT464(0x3f000000);
      uVar26 = uVar34;
      while (uVar26 != 0) {
        lVar28 = 0;
        for (uVar35 = uVar26; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
          lVar28 = lVar28 + 1;
        }
        uVar26 = uVar26 - 1 & uVar26;
        uVar35 = (ulong)(uint)((int)lVar28 * 4);
        auVar37 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar35 + 0x80)),
                                ZEXT416(*(uint *)(ray + uVar35 + 0xa0)),0x1c);
        auVar37 = vinsertps_avx(auVar37,ZEXT416(*(uint *)(ray + uVar35 + 0xc0)),0x28);
        fVar84 = *(float *)((long)&local_27c0 + uVar35);
        auVar96._0_4_ = auVar37._0_4_ * fVar84;
        auVar96._4_4_ = auVar37._4_4_ * fVar84;
        auVar96._8_4_ = auVar37._8_4_ * fVar84;
        auVar96._12_4_ = auVar37._12_4_ * fVar84;
        auVar97 = vshufpd_avx(auVar96,auVar96,1);
        auVar37 = vmovshdup_avx(auVar96);
        auVar38 = vunpckhps_avx(auVar96,auVar85);
        auVar99 = vshufps_avx(auVar38,ZEXT416(auVar37._0_4_ ^ 0x80000000),0x41);
        auVar38._0_8_ = auVar97._0_8_ ^ 0x8000000080000000;
        auVar38._8_8_ = auVar97._8_8_ ^ auVar82._8_8_;
        auVar37 = vdpps_avx(auVar99,auVar99,0x7f);
        auVar38 = vinsertps_avx(auVar38,auVar96,0x2a);
        auVar97 = vdpps_avx(auVar38,auVar38,0x7f);
        uVar8 = vcmpps_avx512vl(auVar97,auVar37,1);
        auVar37 = vpmovm2d_avx512vl(uVar8);
        auVar103._0_4_ = auVar37._0_4_;
        auVar103._4_4_ = auVar103._0_4_;
        auVar103._8_4_ = auVar103._0_4_;
        auVar103._12_4_ = auVar103._0_4_;
        uVar35 = vpmovd2m_avx512vl(auVar103);
        auVar37._4_4_ = (uint)((byte)(uVar35 >> 1) & 1) * auVar90._4_4_;
        auVar37._0_4_ = (uint)((byte)uVar35 & 1) * auVar90._0_4_;
        auVar37._8_4_ = (uint)((byte)(uVar35 >> 2) & 1) * auVar90._8_4_;
        auVar37._12_4_ = (uint)((byte)(uVar35 >> 3) & 1) * auVar90._12_4_;
        auVar37 = vblendvps_avx(auVar38,auVar99,auVar37);
        auVar97 = vdpps_avx(auVar37,auVar37,0x7f);
        auVar38 = vrsqrt14ss_avx512f(auVar85,ZEXT416((uint)auVar97._0_4_));
        fVar89 = auVar38._0_4_;
        fVar89 = fVar89 * 1.5 - auVar97._0_4_ * 0.5 * fVar89 * fVar89 * fVar89;
        auVar99._0_4_ = auVar37._0_4_ * fVar89;
        auVar99._4_4_ = auVar37._4_4_ * fVar89;
        auVar99._8_4_ = auVar37._8_4_ * fVar89;
        auVar99._12_4_ = auVar37._12_4_ * fVar89;
        auVar37 = vshufps_avx(auVar99,auVar99,0xc9);
        auVar97 = vshufps_avx(auVar96,auVar96,0xc9);
        auVar104._0_4_ = auVar99._0_4_ * auVar97._0_4_;
        auVar104._4_4_ = auVar99._4_4_ * auVar97._4_4_;
        auVar104._8_4_ = auVar99._8_4_ * auVar97._8_4_;
        auVar104._12_4_ = auVar99._12_4_ * auVar97._12_4_;
        auVar37 = vfmsub231ps_fma(auVar104,auVar96,auVar37);
        auVar97 = vshufps_avx(auVar37,auVar37,0xc9);
        auVar37 = vdpps_avx(auVar97,auVar97,0x7f);
        auVar38 = vrsqrt14ss_avx512f(auVar85,ZEXT416((uint)auVar37._0_4_));
        fVar89 = auVar38._0_4_;
        fVar89 = fVar89 * 1.5 - auVar37._0_4_ * 0.5 * fVar89 * fVar89 * fVar89;
        auVar101._0_4_ = fVar89 * auVar97._0_4_;
        auVar101._4_4_ = fVar89 * auVar97._4_4_;
        auVar101._8_4_ = fVar89 * auVar97._8_4_;
        auVar101._12_4_ = fVar89 * auVar97._12_4_;
        auVar97._0_4_ = fVar84 * auVar96._0_4_;
        auVar97._4_4_ = fVar84 * auVar96._4_4_;
        auVar97._8_4_ = fVar84 * auVar96._8_4_;
        auVar97._12_4_ = fVar84 * auVar96._12_4_;
        auVar38 = vunpcklps_avx(auVar99,auVar97);
        auVar37 = vunpckhps_avx(auVar99,auVar97);
        auVar99 = vunpcklps_avx(auVar101,auVar85);
        auVar97 = vunpckhps_avx(auVar101,auVar85);
        auVar97 = vunpcklps_avx(auVar37,auVar97);
        in_ZMM9 = ZEXT1664(auVar97);
        auVar96 = vunpcklps_avx(auVar38,auVar99);
        auVar37 = vunpckhps_avx(auVar38,auVar99);
        lVar28 = lVar28 * 0x30;
        *(undefined1 (*) [16])(local_27a0 + lVar28) = auVar96;
        *(undefined1 (*) [16])(auStack_2790 + lVar28) = auVar37;
        *(undefined1 (*) [16])(auStack_2780 + lVar28) = auVar97;
      }
      local_2980._0_8_ = *(undefined8 *)ray;
      local_2980._8_8_ = *(undefined8 *)(ray + 8);
      local_2980._16_8_ = *(undefined8 *)(ray + 0x10);
      local_2980._24_8_ = *(undefined8 *)(ray + 0x18);
      local_2980._32_8_ = *(undefined8 *)(ray + 0x20);
      local_2980._40_8_ = *(undefined8 *)(ray + 0x28);
      local_2980._48_8_ = *(undefined8 *)(ray + 0x30);
      local_2980._56_8_ = *(undefined8 *)(ray + 0x38);
      local_2980._64_8_ = *(undefined8 *)(ray + 0x40);
      local_2980._72_8_ = *(undefined8 *)(ray + 0x48);
      local_2980._80_8_ = *(undefined8 *)(ray + 0x50);
      local_2980._88_8_ = *(undefined8 *)(ray + 0x58);
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar105 = ZEXT3264(auVar40);
      vandps_avx512vl(local_2920,auVar40);
      auVar41 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar106 = ZEXT3264(auVar41);
      uVar26 = vcmpps_avx512vl(auVar40,auVar41,1);
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar107 = ZEXT3264(auVar42);
      auVar39 = vdivps_avx512vl(auVar42,local_2920);
      vandps_avx512vl(local_2900,auVar40);
      uVar35 = vcmpps_avx512vl(auVar39,auVar41,1);
      auVar43 = vdivps_avx512vl(auVar42,local_2900);
      vandps_avx512vl(_local_28e0,auVar40);
      uVar9 = vcmpps_avx512vl(auVar43,auVar41,1);
      auVar40 = vdivps_avx512vl(auVar42,_local_28e0);
      bVar25 = (bool)((byte)uVar26 & 1);
      local_28c0._0_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar39._0_4_;
      bVar25 = (bool)((byte)(uVar26 >> 1) & 1);
      local_28c0._4_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar39._4_4_;
      bVar25 = (bool)((byte)(uVar26 >> 2) & 1);
      fStack_28b8 = (float)((uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar39._8_4_);
      bVar25 = (bool)((byte)(uVar26 >> 3) & 1);
      fStack_28b4 = (float)((uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar39._12_4_);
      bVar25 = (bool)((byte)(uVar26 >> 4) & 1);
      fStack_28b0 = (float)((uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar39._16_4_);
      bVar25 = (bool)((byte)(uVar26 >> 5) & 1);
      fStack_28ac = (float)((uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar39._20_4_);
      bVar25 = (bool)((byte)(uVar26 >> 6) & 1);
      fStack_28a8 = (float)((uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar39._24_4_);
      bVar25 = SUB81(uVar26 >> 7,0);
      uStack_28a4 = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar39._28_4_;
      bVar25 = (bool)((byte)uVar35 & 1);
      local_28a0._0_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar43._0_4_;
      bVar25 = (bool)((byte)(uVar35 >> 1) & 1);
      local_28a0._4_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar43._4_4_;
      bVar25 = (bool)((byte)(uVar35 >> 2) & 1);
      local_28a0._8_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar43._8_4_;
      bVar25 = (bool)((byte)(uVar35 >> 3) & 1);
      local_28a0._12_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar43._12_4_;
      bVar25 = (bool)((byte)(uVar35 >> 4) & 1);
      local_28a0._16_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar43._16_4_;
      bVar25 = (bool)((byte)(uVar35 >> 5) & 1);
      local_28a0._20_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar43._20_4_;
      bVar25 = (bool)((byte)(uVar35 >> 6) & 1);
      local_28a0._24_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar43._24_4_;
      bVar25 = SUB81(uVar35 >> 7,0);
      local_28a0._28_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar43._28_4_;
      bVar25 = (bool)((byte)uVar9 & 1);
      local_2880._0_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar40._0_4_;
      bVar25 = (bool)((byte)(uVar9 >> 1) & 1);
      local_2880._4_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar40._4_4_;
      bVar25 = (bool)((byte)(uVar9 >> 2) & 1);
      local_2880._8_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar40._8_4_;
      bVar25 = (bool)((byte)(uVar9 >> 3) & 1);
      local_2880._12_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar40._12_4_;
      bVar25 = (bool)((byte)(uVar9 >> 4) & 1);
      local_2880._16_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar40._16_4_;
      bVar25 = (bool)((byte)(uVar9 >> 5) & 1);
      local_2880._20_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar40._20_4_;
      bVar25 = (bool)((byte)(uVar9 >> 6) & 1);
      local_2880._24_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar40._24_4_;
      bVar25 = SUB81(uVar9 >> 7,0);
      local_2880._28_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar40._28_4_;
      uVar26 = vcmpps_avx512vl(_local_28c0,ZEXT832(0) << 0x20,1);
      auVar40 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      local_2860._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * auVar40._4_4_;
      local_2860._0_4_ = (uint)((byte)uVar26 & 1) * auVar40._0_4_;
      local_2860._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * auVar40._8_4_;
      local_2860._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * auVar40._12_4_;
      local_2860._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar40._16_4_;
      local_2860._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar40._20_4_;
      local_2860._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar40._24_4_;
      local_2860._28_4_ = (uint)(byte)(uVar26 >> 7) * auVar40._28_4_;
      uVar26 = vcmpps_avx512vl(local_28a0,ZEXT832(0) << 0x20,5);
      auVar40 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar25 = (bool)((byte)uVar26 & 1);
      local_2840 = (uint)bVar25 * auVar40._0_4_ | (uint)!bVar25 * 0x30;
      bVar25 = (bool)((byte)(uVar26 >> 1) & 1);
      uStack_283c = (uint)bVar25 * auVar40._4_4_ | (uint)!bVar25 * 0x30;
      bVar25 = (bool)((byte)(uVar26 >> 2) & 1);
      uStack_2838 = (uint)bVar25 * auVar40._8_4_ | (uint)!bVar25 * 0x30;
      bVar25 = (bool)((byte)(uVar26 >> 3) & 1);
      uStack_2834 = (uint)bVar25 * auVar40._12_4_ | (uint)!bVar25 * 0x30;
      bVar25 = (bool)((byte)(uVar26 >> 4) & 1);
      uStack_2830 = (uint)bVar25 * auVar40._16_4_ | (uint)!bVar25 * 0x30;
      bVar25 = (bool)((byte)(uVar26 >> 5) & 1);
      uStack_282c = (uint)bVar25 * auVar40._20_4_ | (uint)!bVar25 * 0x30;
      bVar25 = (bool)((byte)(uVar26 >> 6) & 1);
      uStack_2828 = (uint)bVar25 * auVar40._24_4_ | (uint)!bVar25 * 0x30;
      bVar25 = SUB81(uVar26 >> 7,0);
      uStack_2824 = (uint)bVar25 * auVar40._28_4_ | (uint)!bVar25 * 0x30;
      auVar41 = ZEXT832(0) << 0x20;
      uVar26 = vcmpps_avx512vl(local_2880,auVar41,5);
      auVar40 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar25 = (bool)((byte)uVar26 & 1);
      local_2820 = (uint)bVar25 * auVar40._0_4_ | (uint)!bVar25 * 0x50;
      bVar25 = (bool)((byte)(uVar26 >> 1) & 1);
      uStack_281c = (uint)bVar25 * auVar40._4_4_ | (uint)!bVar25 * 0x50;
      bVar25 = (bool)((byte)(uVar26 >> 2) & 1);
      uStack_2818 = (uint)bVar25 * auVar40._8_4_ | (uint)!bVar25 * 0x50;
      bVar25 = (bool)((byte)(uVar26 >> 3) & 1);
      uStack_2814 = (uint)bVar25 * auVar40._12_4_ | (uint)!bVar25 * 0x50;
      bVar25 = (bool)((byte)(uVar26 >> 4) & 1);
      uStack_2810 = (uint)bVar25 * auVar40._16_4_ | (uint)!bVar25 * 0x50;
      bVar25 = (bool)((byte)(uVar26 >> 5) & 1);
      uStack_280c = (uint)bVar25 * auVar40._20_4_ | (uint)!bVar25 * 0x50;
      bVar25 = (bool)((byte)(uVar26 >> 6) & 1);
      uStack_2808 = (uint)bVar25 * auVar40._24_4_ | (uint)!bVar25 * 0x50;
      bVar25 = SUB81(uVar26 >> 7,0);
      uStack_2804 = (uint)bVar25 * auVar40._28_4_ | (uint)!bVar25 * 0x50;
      local_1e80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar108 = ZEXT3264(local_1e80);
      auVar40 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar41);
      local_2800._0_4_ =
           (uint)(bVar33 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar33 & 1) * local_1e80._0_4_;
      bVar25 = (bool)((byte)(uVar34 >> 1) & 1);
      local_2800._4_4_ = (uint)bVar25 * auVar40._4_4_ | (uint)!bVar25 * local_1e80._4_4_;
      bVar25 = (bool)((byte)(uVar34 >> 2) & 1);
      local_2800._8_4_ = (uint)bVar25 * auVar40._8_4_ | (uint)!bVar25 * local_1e80._8_4_;
      bVar25 = (bool)((byte)(uVar34 >> 3) & 1);
      local_2800._12_4_ = (uint)bVar25 * auVar40._12_4_ | (uint)!bVar25 * local_1e80._12_4_;
      bVar25 = (bool)((byte)(uVar34 >> 4) & 1);
      local_2800._16_4_ = (uint)bVar25 * auVar40._16_4_ | (uint)!bVar25 * local_1e80._16_4_;
      bVar25 = (bool)((byte)(uVar34 >> 5) & 1);
      local_2800._20_4_ = (uint)bVar25 * auVar40._20_4_ | (uint)!bVar25 * local_1e80._20_4_;
      bVar25 = (bool)((byte)(uVar34 >> 6) & 1);
      local_2800._24_4_ = (uint)bVar25 * auVar40._24_4_ | (uint)!bVar25 * local_1e80._24_4_;
      bVar25 = SUB81(uVar34 >> 7,0);
      local_2800._28_4_ = (uint)bVar25 * auVar40._28_4_ | (uint)!bVar25 * local_1e80._28_4_;
      auVar44 = vmaxps_avx512vl(auVar44,auVar41);
      local_27e0._0_4_ = (uint)(bVar33 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar33 & 1) * -0x800000;
      bVar25 = (bool)((byte)(uVar34 >> 1) & 1);
      local_27e0._4_4_ = (uint)bVar25 * auVar44._4_4_ | (uint)!bVar25 * -0x800000;
      bVar25 = (bool)((byte)(uVar34 >> 2) & 1);
      local_27e0._8_4_ = (uint)bVar25 * auVar44._8_4_ | (uint)!bVar25 * -0x800000;
      bVar25 = (bool)((byte)(uVar34 >> 3) & 1);
      local_27e0._12_4_ = (uint)bVar25 * auVar44._12_4_ | (uint)!bVar25 * -0x800000;
      bVar25 = (bool)((byte)(uVar34 >> 4) & 1);
      local_27e0._16_4_ = (uint)bVar25 * auVar44._16_4_ | (uint)!bVar25 * -0x800000;
      bVar25 = (bool)((byte)(uVar34 >> 5) & 1);
      local_27e0._20_4_ = (uint)bVar25 * auVar44._20_4_ | (uint)!bVar25 * -0x800000;
      bVar25 = (bool)((byte)(uVar34 >> 6) & 1);
      local_27e0._24_4_ = (uint)bVar25 * auVar44._24_4_ | (uint)!bVar25 * -0x800000;
      bVar25 = SUB81(uVar34 >> 7,0);
      local_27e0._28_4_ = (uint)bVar25 * auVar44._28_4_ | (uint)!bVar25 * -0x800000;
      local_29e4 = (uint)(byte)~bVar33;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar29 = 5;
      }
      else {
        uVar29 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      puVar27 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar30 = (undefined1 (*) [32])local_1e40;
      local_2608 = sVar1;
      local_1e60 = local_2800;
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar109 = ZEXT3264(auVar44);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar110 = ZEXT3264(auVar44);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar112 = ZEXT3264(auVar44);
LAB_01d0f15c:
      do {
        do {
          root.ptr = puVar27[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01d0f763;
          puVar27 = puVar27 + -1;
          auVar44 = pauVar30[-1];
          auVar113 = ZEXT3264(auVar44);
          pauVar30 = pauVar30 + -1;
          uVar34 = vcmpps_avx512vl(auVar44,local_27e0,1);
        } while ((char)uVar34 == '\0');
        uVar32 = (undefined4)uVar34;
        if (uVar29 < (uint)POPCOUNT(uVar32)) {
LAB_01d0f1a5:
          do {
            lVar28 = 0x1c;
            uVar34 = 8;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01d0f763;
              uVar8 = vcmpps_avx512vl(auVar113._0_32_,local_27e0,9);
              if ((char)uVar8 != '\0') {
                bVar24 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                pvVar2 = This->leafIntersector;
                uVar34 = (ulong)(byte)~(byte)local_29e4;
                bVar31 = 0;
                while (uVar34 != 0) {
                  lVar28 = 0;
                  for (uVar26 = uVar34; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000
                      ) {
                    lVar28 = lVar28 + 1;
                  }
                  uVar34 = uVar34 - 1 & uVar34;
                  auVar88 = ZEXT1664(auVar88._0_16_);
                  auVar93 = ZEXT1664(auVar93._0_16_);
                  auVar94 = ZEXT1664(auVar94._0_16_);
                  in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                  cVar23 = (**(code **)((long)pvVar2 + (ulong)bVar24 * 0x40 + 0x28))
                                     (&local_27c0,ray,lVar28,context,
                                      (byte *)(root.ptr & 0xfffffffffffffff0));
                  bVar15 = (byte)(1 << ((uint)lVar28 & 0x1f));
                  if (cVar23 == '\0') {
                    bVar15 = 0;
                  }
                  bVar31 = bVar31 | bVar15;
                }
                bVar31 = (byte)local_29e4 | bVar31;
                local_29e4 = (uint)bVar31;
                auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar105 = ZEXT3264(auVar44);
                auVar44 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                auVar106 = ZEXT3264(auVar44);
                auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar107 = ZEXT3264(auVar44);
                auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar108 = ZEXT3264(auVar44);
                auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar109 = ZEXT3264(auVar44);
                auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar110 = ZEXT3264(auVar44);
                auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar112 = ZEXT3264(auVar44);
                if (bVar31 == 0xff) {
                  local_29e4._0_1_ = 0xff;
                  goto LAB_01d0f763;
                }
                auVar44 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar25 = (bool)(bVar31 >> 1 & 1);
                bVar3 = (bool)(bVar31 >> 2 & 1);
                bVar4 = (bool)(bVar31 >> 3 & 1);
                bVar5 = (bool)(bVar31 >> 4 & 1);
                bVar6 = (bool)(bVar31 >> 5 & 1);
                bVar7 = (bool)(bVar31 >> 6 & 1);
                local_27e0._4_4_ = (uint)bVar25 * auVar44._4_4_ | (uint)!bVar25 * local_27e0._4_4_;
                local_27e0._0_4_ =
                     (uint)(bVar31 & 1) * auVar44._0_4_ |
                     (uint)!(bool)(bVar31 & 1) * local_27e0._0_4_;
                local_27e0._8_4_ = (uint)bVar3 * auVar44._8_4_ | (uint)!bVar3 * local_27e0._8_4_;
                local_27e0._12_4_ = (uint)bVar4 * auVar44._12_4_ | (uint)!bVar4 * local_27e0._12_4_;
                local_27e0._16_4_ = (uint)bVar5 * auVar44._16_4_ | (uint)!bVar5 * local_27e0._16_4_;
                local_27e0._20_4_ = (uint)bVar6 * auVar44._20_4_ | (uint)!bVar6 * local_27e0._20_4_;
                local_27e0._24_4_ = (uint)bVar7 * auVar44._24_4_ | (uint)!bVar7 * local_27e0._24_4_;
                local_27e0._28_4_ =
                     (uint)(bVar31 >> 7) * auVar44._28_4_ |
                     (uint)!(bool)(bVar31 >> 7) * local_27e0._28_4_;
              }
              goto LAB_01d0f15c;
            }
            uVar26 = root.ptr & 0xfffffffffffffff0;
            auVar44 = auVar108._0_32_;
            for (; (auVar113 = ZEXT3264(auVar44), lVar28 != 0x20 &&
                   (uVar35 = *(ulong *)((uVar26 - 0xe0) + lVar28 * 8), uVar35 != 8));
                lVar28 = lVar28 + 1) {
              auVar113._28_36_ = auVar88._28_36_;
              auVar98._28_36_ = in_ZMM9._28_36_;
              if ((root.ptr & 7) == 0) {
                uVar32 = *(undefined4 *)((root.ptr - 0x50) + lVar28 * 4);
                auVar58._4_4_ = uVar32;
                auVar58._0_4_ = uVar32;
                auVar58._8_4_ = uVar32;
                auVar58._12_4_ = uVar32;
                auVar58._16_4_ = uVar32;
                auVar58._20_4_ = uVar32;
                auVar58._24_4_ = uVar32;
                auVar58._28_4_ = uVar32;
                auVar16._8_8_ = local_2980._8_8_;
                auVar16._0_8_ = local_2980._0_8_;
                auVar16._16_8_ = local_2980._16_8_;
                auVar16._24_8_ = local_2980._24_8_;
                auVar18._8_8_ = local_2980._40_8_;
                auVar18._0_8_ = local_2980._32_8_;
                auVar18._16_8_ = local_2980._48_8_;
                auVar18._24_8_ = local_2980._56_8_;
                auVar20._8_8_ = local_2980._72_8_;
                auVar20._0_8_ = local_2980._64_8_;
                auVar20._16_8_ = local_2980._80_8_;
                auVar20._24_8_ = local_2980._88_8_;
                auVar40 = vsubps_avx(auVar58,auVar16);
                auVar113._0_4_ = (float)local_28c0._0_4_ * auVar40._0_4_;
                auVar113._4_4_ = (float)local_28c0._4_4_ * auVar40._4_4_;
                auVar113._8_4_ = fStack_28b8 * auVar40._8_4_;
                auVar113._12_4_ = fStack_28b4 * auVar40._12_4_;
                auVar113._16_4_ = fStack_28b0 * auVar40._16_4_;
                auVar113._20_4_ = fStack_28ac * auVar40._20_4_;
                auVar113._24_4_ = fStack_28a8 * auVar40._24_4_;
                auVar86 = auVar113._0_32_;
                uVar32 = *(undefined4 *)((root.ptr - 0x30) + lVar28 * 4);
                auVar59._4_4_ = uVar32;
                auVar59._0_4_ = uVar32;
                auVar59._8_4_ = uVar32;
                auVar59._12_4_ = uVar32;
                auVar59._16_4_ = uVar32;
                auVar59._20_4_ = uVar32;
                auVar59._24_4_ = uVar32;
                auVar59._28_4_ = uVar32;
                auVar40 = vsubps_avx(auVar59,auVar18);
                auVar93._0_4_ = local_28a0._0_4_ * auVar40._0_4_;
                auVar93._4_4_ = local_28a0._4_4_ * auVar40._4_4_;
                auVar93._8_4_ = local_28a0._8_4_ * auVar40._8_4_;
                auVar93._12_4_ = local_28a0._12_4_ * auVar40._12_4_;
                auVar93._16_4_ = local_28a0._16_4_ * auVar40._16_4_;
                auVar93._20_4_ = local_28a0._20_4_ * auVar40._20_4_;
                auVar93._24_4_ = local_28a0._24_4_ * auVar40._24_4_;
                auVar39 = auVar93._0_32_;
                uVar32 = *(undefined4 *)((root.ptr - 0x10) + lVar28 * 4);
                auVar60._4_4_ = uVar32;
                auVar60._0_4_ = uVar32;
                auVar60._8_4_ = uVar32;
                auVar60._12_4_ = uVar32;
                auVar60._16_4_ = uVar32;
                auVar60._20_4_ = uVar32;
                auVar60._24_4_ = uVar32;
                auVar60._28_4_ = uVar32;
                auVar40 = vsubps_avx(auVar60,auVar20);
                auVar94 = ZEXT3264(local_2880);
                auVar98._0_4_ = local_2880._0_4_ * auVar40._0_4_;
                auVar98._4_4_ = local_2880._4_4_ * auVar40._4_4_;
                auVar98._8_4_ = local_2880._8_4_ * auVar40._8_4_;
                auVar98._12_4_ = local_2880._12_4_ * auVar40._12_4_;
                auVar98._16_4_ = local_2880._16_4_ * auVar40._16_4_;
                auVar98._20_4_ = local_2880._20_4_ * auVar40._20_4_;
                auVar98._24_4_ = local_2880._24_4_ * auVar40._24_4_;
                auVar43 = auVar98._0_32_;
                in_ZMM9 = ZEXT3264(auVar43);
                uVar32 = *(undefined4 *)((root.ptr - 0x40) + lVar28 * 4);
                auVar61._4_4_ = uVar32;
                auVar61._0_4_ = uVar32;
                auVar61._8_4_ = uVar32;
                auVar61._12_4_ = uVar32;
                auVar61._16_4_ = uVar32;
                auVar61._20_4_ = uVar32;
                auVar61._24_4_ = uVar32;
                auVar61._28_4_ = uVar32;
                auVar40 = vsubps_avx(auVar61,auVar16);
                uVar32 = *(undefined4 *)((root.ptr - 0x20) + lVar28 * 4);
                auVar70._4_4_ = uVar32;
                auVar70._0_4_ = uVar32;
                auVar70._8_4_ = uVar32;
                auVar70._12_4_ = uVar32;
                auVar70._16_4_ = uVar32;
                auVar70._20_4_ = uVar32;
                auVar70._24_4_ = uVar32;
                auVar70._28_4_ = uVar32;
                auVar10._4_4_ = (float)local_28c0._4_4_ * auVar40._4_4_;
                auVar10._0_4_ = (float)local_28c0._0_4_ * auVar40._0_4_;
                auVar10._8_4_ = fStack_28b8 * auVar40._8_4_;
                auVar10._12_4_ = fStack_28b4 * auVar40._12_4_;
                auVar10._16_4_ = fStack_28b0 * auVar40._16_4_;
                auVar10._20_4_ = fStack_28ac * auVar40._20_4_;
                auVar10._24_4_ = fStack_28a8 * auVar40._24_4_;
                auVar10._28_4_ = uStack_28a4;
                auVar40 = vsubps_avx(auVar70,auVar18);
                auVar11._4_4_ = local_28a0._4_4_ * auVar40._4_4_;
                auVar11._0_4_ = local_28a0._0_4_ * auVar40._0_4_;
                auVar11._8_4_ = local_28a0._8_4_ * auVar40._8_4_;
                auVar11._12_4_ = local_28a0._12_4_ * auVar40._12_4_;
                auVar11._16_4_ = local_28a0._16_4_ * auVar40._16_4_;
                auVar11._20_4_ = local_28a0._20_4_ * auVar40._20_4_;
                auVar11._24_4_ = local_28a0._24_4_ * auVar40._24_4_;
                auVar11._28_4_ = uVar32;
                uVar32 = *(undefined4 *)(root.ptr + lVar28 * 4);
                auVar62._4_4_ = uVar32;
                auVar62._0_4_ = uVar32;
                auVar62._8_4_ = uVar32;
                auVar62._12_4_ = uVar32;
                auVar62._16_4_ = uVar32;
                auVar62._20_4_ = uVar32;
                auVar62._24_4_ = uVar32;
                auVar62._28_4_ = uVar32;
                auVar40 = vsubps_avx(auVar62,auVar20);
                auVar12._4_4_ = local_2880._4_4_ * auVar40._4_4_;
                auVar12._0_4_ = local_2880._0_4_ * auVar40._0_4_;
                auVar12._8_4_ = local_2880._8_4_ * auVar40._8_4_;
                auVar12._12_4_ = local_2880._12_4_ * auVar40._12_4_;
                auVar12._16_4_ = local_2880._16_4_ * auVar40._16_4_;
                auVar12._20_4_ = local_2880._20_4_ * auVar40._20_4_;
                auVar12._24_4_ = local_2880._24_4_ * auVar40._24_4_;
                auVar12._28_4_ = (int)((ulong)local_2980._56_8_ >> 0x20);
                auVar40 = vminps_avx(auVar86,auVar10);
                auVar41 = vminps_avx(auVar39,auVar11);
                auVar40 = vmaxps_avx(auVar40,auVar41);
                auVar41 = vminps_avx(auVar43,auVar12);
                auVar40 = vmaxps_avx(auVar40,auVar41);
                auVar42 = vmulps_avx512vl(auVar40,auVar109._0_32_);
                auVar40 = vmaxps_avx(auVar86,auVar10);
                auVar41 = vmaxps_avx(auVar39,auVar11);
                auVar41 = vminps_avx(auVar40,auVar41);
                auVar40 = vmaxps_avx(auVar43,auVar12);
                auVar40 = vminps_avx(auVar41,auVar40);
                auVar41 = vmulps_avx512vl(auVar40,auVar110._0_32_);
                auVar40 = vmaxps_avx(auVar42,local_2800);
                auVar41 = vminps_avx(auVar41,local_27e0);
              }
              else {
                fVar84 = *(float *)((uVar26 - 0x50) + lVar28 * 4);
                auVar73._4_4_ = fVar84;
                auVar73._0_4_ = fVar84;
                auVar73._8_4_ = fVar84;
                auVar73._12_4_ = fVar84;
                auVar73._16_4_ = fVar84;
                auVar73._20_4_ = fVar84;
                auVar73._24_4_ = fVar84;
                auVar73._28_4_ = fVar84;
                uVar32 = *(undefined4 *)((uVar26 - 0x40) + lVar28 * 4);
                auVar71._4_4_ = uVar32;
                auVar71._0_4_ = uVar32;
                auVar71._8_4_ = uVar32;
                auVar71._12_4_ = uVar32;
                auVar71._16_4_ = uVar32;
                auVar71._20_4_ = uVar32;
                auVar71._24_4_ = uVar32;
                auVar71._28_4_ = uVar32;
                fVar89 = *(float *)((uVar26 - 0x30) + lVar28 * 4);
                auVar63._4_4_ = fVar89;
                auVar63._0_4_ = fVar89;
                auVar63._8_4_ = fVar89;
                auVar63._12_4_ = fVar89;
                auVar63._16_4_ = fVar89;
                auVar63._20_4_ = fVar89;
                auVar63._24_4_ = fVar89;
                auVar63._28_4_ = fVar89;
                uVar32 = *(undefined4 *)((uVar26 - 0x20) + lVar28 * 4);
                auVar102._4_4_ = uVar32;
                auVar102._0_4_ = uVar32;
                auVar102._8_4_ = uVar32;
                auVar102._12_4_ = uVar32;
                auVar102._16_4_ = uVar32;
                auVar102._20_4_ = uVar32;
                auVar102._24_4_ = uVar32;
                auVar102._28_4_ = uVar32;
                uVar32 = *(undefined4 *)((uVar26 - 0x10) + lVar28 * 4);
                auVar100._4_4_ = uVar32;
                auVar100._0_4_ = uVar32;
                auVar100._8_4_ = uVar32;
                auVar100._12_4_ = uVar32;
                auVar100._16_4_ = uVar32;
                auVar100._20_4_ = uVar32;
                auVar100._24_4_ = uVar32;
                auVar100._28_4_ = uVar32;
                uVar32 = *(undefined4 *)(uVar26 + lVar28 * 4);
                auVar92._4_4_ = uVar32;
                auVar92._0_4_ = uVar32;
                auVar92._8_4_ = uVar32;
                auVar92._12_4_ = uVar32;
                auVar92._16_4_ = uVar32;
                auVar92._20_4_ = uVar32;
                auVar92._24_4_ = uVar32;
                auVar92._28_4_ = uVar32;
                fVar57 = *(float *)(uVar26 + 0x10 + lVar28 * 4);
                auVar91._4_4_ = fVar57;
                auVar91._0_4_ = fVar57;
                auVar91._8_4_ = fVar57;
                auVar91._12_4_ = fVar57;
                auVar91._16_4_ = fVar57;
                auVar91._20_4_ = fVar57;
                auVar91._24_4_ = fVar57;
                auVar91._28_4_ = fVar57;
                fVar64 = *(float *)(uVar26 + 0x20 + lVar28 * 4);
                auVar87._4_4_ = fVar64;
                auVar87._0_4_ = fVar64;
                auVar87._8_4_ = fVar64;
                auVar87._12_4_ = fVar64;
                auVar87._16_4_ = fVar64;
                auVar87._20_4_ = fVar64;
                auVar87._24_4_ = fVar64;
                auVar87._28_4_ = fVar64;
                fVar65 = *(float *)(uVar26 + 0x30 + lVar28 * 4);
                auVar80._4_4_ = fVar65;
                auVar80._0_4_ = fVar65;
                auVar80._8_4_ = fVar65;
                auVar80._12_4_ = fVar65;
                auVar80._16_4_ = fVar65;
                auVar80._20_4_ = fVar65;
                auVar80._24_4_ = fVar65;
                auVar80._28_4_ = fVar65;
                auVar17._8_8_ = local_2980._8_8_;
                auVar17._0_8_ = local_2980._0_8_;
                auVar17._16_8_ = local_2980._16_8_;
                auVar17._24_8_ = local_2980._24_8_;
                auVar19._8_8_ = local_2980._40_8_;
                auVar19._0_8_ = local_2980._32_8_;
                auVar19._16_8_ = local_2980._48_8_;
                auVar19._24_8_ = local_2980._56_8_;
                auVar21._8_8_ = local_2980._72_8_;
                auVar21._0_8_ = local_2980._64_8_;
                auVar21._16_8_ = local_2980._80_8_;
                auVar21._24_8_ = local_2980._88_8_;
                auVar95._0_4_ = (float)local_28e0._0_4_ * fVar57;
                auVar95._4_4_ = (float)local_28e0._4_4_ * fVar57;
                auVar95._8_4_ = fStack_28d8 * fVar57;
                auVar95._12_4_ = fStack_28d4 * fVar57;
                auVar95._16_4_ = fStack_28d0 * fVar57;
                auVar95._20_4_ = fStack_28cc * fVar57;
                auVar95._28_36_ = auVar94._28_36_;
                auVar95._24_4_ = fStack_28c8 * fVar57;
                auVar94._0_4_ = (float)local_28e0._0_4_ * fVar64;
                auVar94._4_4_ = (float)local_28e0._4_4_ * fVar64;
                auVar94._8_4_ = fStack_28d8 * fVar64;
                auVar94._12_4_ = fStack_28d4 * fVar64;
                auVar94._16_4_ = fStack_28d0 * fVar64;
                auVar94._20_4_ = fStack_28cc * fVar64;
                auVar94._24_4_ = fStack_28c8 * fVar64;
                auVar94._28_36_ = auVar98._28_36_;
                auVar111._4_4_ = (float)local_28e0._4_4_ * fVar65;
                auVar111._0_4_ = (float)local_28e0._0_4_ * fVar65;
                auVar111._8_4_ = fStack_28d8 * fVar65;
                auVar111._12_4_ = fStack_28d4 * fVar65;
                auVar111._16_4_ = fStack_28d0 * fVar65;
                auVar111._20_4_ = fStack_28cc * fVar65;
                auVar111._24_4_ = fStack_28c8 * fVar65;
                auVar111._28_4_ = uStack_28c4;
                auVar40 = vfmadd231ps_avx512vl(auVar95._0_32_,local_2900,auVar102);
                auVar41 = vfmadd231ps_avx512vl(auVar94._0_32_,local_2900,auVar100);
                auVar42 = vfmadd231ps_avx512vl(auVar111,auVar92,local_2900);
                auVar90 = vfmadd231ps_fma(auVar40,local_2920,auVar73);
                auVar85 = vfmadd231ps_fma(auVar41,local_2920,auVar71);
                auVar82 = vfmadd231ps_fma(auVar42,auVar63,local_2920);
                auVar40 = auVar105._0_32_;
                vandps_avx512vl(ZEXT1632(auVar90),auVar40);
                auVar41 = auVar106._0_32_;
                uVar9 = vcmpps_avx512vl(auVar42,auVar41,1);
                bVar25 = (bool)((byte)uVar9 & 1);
                iVar36 = auVar106._0_4_;
                auVar46._0_4_ = (uint)bVar25 * iVar36 | (uint)!bVar25 * auVar90._0_4_;
                bVar25 = (bool)((byte)(uVar9 >> 1) & 1);
                iVar50 = auVar106._4_4_;
                auVar46._4_4_ = (uint)bVar25 * iVar50 | (uint)!bVar25 * auVar90._4_4_;
                bVar25 = (bool)((byte)(uVar9 >> 2) & 1);
                iVar51 = auVar106._8_4_;
                auVar46._8_4_ = (uint)bVar25 * iVar51 | (uint)!bVar25 * auVar90._8_4_;
                bVar25 = (bool)((byte)(uVar9 >> 3) & 1);
                iVar52 = auVar106._12_4_;
                auVar46._12_4_ = (uint)bVar25 * iVar52 | (uint)!bVar25 * auVar90._12_4_;
                iVar53 = auVar106._16_4_;
                auVar46._16_4_ = (uint)((byte)(uVar9 >> 4) & 1) * iVar53;
                iVar54 = auVar106._20_4_;
                auVar46._20_4_ = (uint)((byte)(uVar9 >> 5) & 1) * iVar54;
                iVar55 = auVar106._24_4_;
                iVar56 = auVar106._28_4_;
                auVar46._24_4_ = (uint)((byte)(uVar9 >> 6) & 1) * iVar55;
                auVar46._28_4_ = (uint)(byte)(uVar9 >> 7) * iVar56;
                vandps_avx512vl(ZEXT1632(auVar85),auVar40);
                uVar9 = vcmpps_avx512vl(auVar46,auVar41,1);
                bVar25 = (bool)((byte)uVar9 & 1);
                auVar47._0_4_ = (uint)bVar25 * iVar36 | (uint)!bVar25 * auVar85._0_4_;
                bVar25 = (bool)((byte)(uVar9 >> 1) & 1);
                auVar47._4_4_ = (uint)bVar25 * iVar50 | (uint)!bVar25 * auVar85._4_4_;
                bVar25 = (bool)((byte)(uVar9 >> 2) & 1);
                auVar47._8_4_ = (uint)bVar25 * iVar51 | (uint)!bVar25 * auVar85._8_4_;
                bVar25 = (bool)((byte)(uVar9 >> 3) & 1);
                auVar47._12_4_ = (uint)bVar25 * iVar52 | (uint)!bVar25 * auVar85._12_4_;
                auVar47._16_4_ = (uint)((byte)(uVar9 >> 4) & 1) * iVar53;
                auVar47._20_4_ = (uint)((byte)(uVar9 >> 5) & 1) * iVar54;
                auVar47._24_4_ = (uint)((byte)(uVar9 >> 6) & 1) * iVar55;
                auVar47._28_4_ = (uint)(byte)(uVar9 >> 7) * iVar56;
                vandps_avx512vl(ZEXT1632(auVar82),auVar40);
                uVar9 = vcmpps_avx512vl(auVar47,auVar41,1);
                bVar25 = (bool)((byte)uVar9 & 1);
                auVar48._0_4_ = (uint)bVar25 * iVar36 | (uint)!bVar25 * auVar82._0_4_;
                bVar25 = (bool)((byte)(uVar9 >> 1) & 1);
                auVar48._4_4_ = (uint)bVar25 * iVar50 | (uint)!bVar25 * auVar82._4_4_;
                bVar25 = (bool)((byte)(uVar9 >> 2) & 1);
                auVar48._8_4_ = (uint)bVar25 * iVar51 | (uint)!bVar25 * auVar82._8_4_;
                bVar25 = (bool)((byte)(uVar9 >> 3) & 1);
                auVar48._12_4_ = (uint)bVar25 * iVar52 | (uint)!bVar25 * auVar82._12_4_;
                auVar48._16_4_ = (uint)((byte)(uVar9 >> 4) & 1) * iVar53;
                auVar48._20_4_ = (uint)((byte)(uVar9 >> 5) & 1) * iVar54;
                auVar48._24_4_ = (uint)((byte)(uVar9 >> 6) & 1) * iVar55;
                auVar48._28_4_ = (uint)(byte)(uVar9 >> 7) * iVar56;
                auVar40 = vrcp14ps_avx512vl(auVar46);
                auVar42 = auVar107._0_32_;
                auVar41 = vfnmadd213ps_avx512vl(auVar46,auVar40,auVar42);
                auVar90 = vfmadd132ps_fma(auVar41,auVar40,auVar40);
                auVar94 = ZEXT1664(auVar90);
                auVar40 = vrcp14ps_avx512vl(auVar47);
                auVar41 = vfnmadd213ps_avx512vl(auVar47,auVar40,auVar42);
                auVar85 = vfmadd132ps_fma(auVar41,auVar40,auVar40);
                in_ZMM9 = ZEXT1664(auVar85);
                auVar40 = vrcp14ps_avx512vl(auVar48);
                auVar41 = vfnmadd213ps_avx512vl(auVar48,auVar40,auVar42);
                auVar82 = vfmadd132ps_fma(auVar41,auVar40,auVar40);
                auVar111 = auVar112._0_32_;
                auVar40 = vxorps_avx512vl(ZEXT1632(auVar90),auVar111);
                auVar41 = vxorps_avx512vl(ZEXT1632(auVar85),auVar111);
                uVar32 = *(undefined4 *)(uVar26 + 0x40 + lVar28 * 4);
                auVar39._4_4_ = uVar32;
                auVar39._0_4_ = uVar32;
                auVar39._8_4_ = uVar32;
                auVar39._12_4_ = uVar32;
                auVar39._16_4_ = uVar32;
                auVar39._20_4_ = uVar32;
                auVar39._24_4_ = uVar32;
                auVar39._28_4_ = uVar32;
                auVar42 = vfmadd213ps_avx512vl(auVar91,auVar21,auVar39);
                uVar32 = *(undefined4 *)(uVar26 + 0x50 + lVar28 * 4);
                auVar43._4_4_ = uVar32;
                auVar43._0_4_ = uVar32;
                auVar43._8_4_ = uVar32;
                auVar43._12_4_ = uVar32;
                auVar43._16_4_ = uVar32;
                auVar43._20_4_ = uVar32;
                auVar43._24_4_ = uVar32;
                auVar43._28_4_ = uVar32;
                auVar39 = vfmadd213ps_avx512vl(auVar87,auVar21,auVar43);
                uVar32 = *(undefined4 *)(uVar26 + 0x60 + lVar28 * 4);
                auVar49._4_4_ = uVar32;
                auVar49._0_4_ = uVar32;
                auVar49._8_4_ = uVar32;
                auVar49._12_4_ = uVar32;
                auVar49._16_4_ = uVar32;
                auVar49._20_4_ = uVar32;
                auVar49._24_4_ = uVar32;
                auVar49._28_4_ = uVar32;
                auVar43 = vfmadd213ps_avx512vl(auVar80,auVar21,auVar49);
                auVar49 = vxorps_avx512vl(ZEXT1632(auVar82),auVar111);
                auVar37 = vfmadd231ps_fma(auVar42,auVar19,auVar102);
                auVar97 = vfmadd231ps_fma(auVar39,auVar19,auVar100);
                auVar38 = vfmadd231ps_fma(auVar43,auVar19,auVar92);
                auVar37 = vfmadd231ps_fma(ZEXT1632(auVar37),auVar17,auVar73);
                fVar72 = auVar40._0_4_ * auVar37._0_4_;
                fVar74 = auVar40._4_4_ * auVar37._4_4_;
                auVar13._4_4_ = fVar74;
                auVar13._0_4_ = fVar72;
                fVar75 = auVar40._8_4_ * auVar37._8_4_;
                auVar13._8_4_ = fVar75;
                fVar76 = auVar40._12_4_ * auVar37._12_4_;
                auVar13._12_4_ = fVar76;
                fVar77 = auVar40._16_4_ * 0.0;
                auVar13._16_4_ = fVar77;
                fVar78 = auVar40._20_4_ * 0.0;
                auVar13._20_4_ = fVar78;
                fVar79 = auVar40._24_4_ * 0.0;
                auVar13._24_4_ = fVar79;
                auVar13._28_4_ = fVar84;
                auVar37 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar17,auVar71);
                auVar42 = vmulps_avx512vl(ZEXT1632(auVar37),auVar41);
                auVar37 = vfmadd231ps_fma(ZEXT1632(auVar38),auVar17,auVar63);
                fVar57 = auVar49._0_4_ * auVar37._0_4_;
                fVar64 = auVar49._4_4_ * auVar37._4_4_;
                auVar14._4_4_ = fVar64;
                auVar14._0_4_ = fVar57;
                fVar65 = auVar49._8_4_ * auVar37._8_4_;
                auVar14._8_4_ = fVar65;
                fVar66 = auVar49._12_4_ * auVar37._12_4_;
                auVar14._12_4_ = fVar66;
                fVar67 = auVar49._16_4_ * 0.0;
                auVar14._16_4_ = fVar67;
                fVar68 = auVar49._20_4_ * 0.0;
                auVar14._20_4_ = fVar68;
                fVar69 = auVar49._24_4_ * 0.0;
                auVar14._24_4_ = fVar69;
                auVar14._28_4_ = fVar89;
                auVar81._0_4_ = auVar90._0_4_ + fVar72;
                auVar81._4_4_ = auVar90._4_4_ + fVar74;
                auVar81._8_4_ = auVar90._8_4_ + fVar75;
                auVar81._12_4_ = auVar90._12_4_ + fVar76;
                auVar81._16_4_ = fVar77 + 0.0;
                auVar81._20_4_ = fVar78 + 0.0;
                auVar81._24_4_ = fVar79 + 0.0;
                auVar81._28_4_ = fVar84 + 0.0;
                auVar83._0_4_ = auVar85._0_4_ + auVar42._0_4_;
                auVar83._4_4_ = auVar85._4_4_ + auVar42._4_4_;
                auVar83._8_4_ = auVar85._8_4_ + auVar42._8_4_;
                auVar83._12_4_ = auVar85._12_4_ + auVar42._12_4_;
                auVar83._16_4_ = auVar42._16_4_ + 0.0;
                auVar83._20_4_ = auVar42._20_4_ + 0.0;
                auVar83._24_4_ = auVar42._24_4_ + 0.0;
                auVar83._28_4_ = auVar42._28_4_ + 0.0;
                auVar86._0_4_ = auVar82._0_4_ + fVar57;
                auVar86._4_4_ = auVar82._4_4_ + fVar64;
                auVar86._8_4_ = auVar82._8_4_ + fVar65;
                auVar86._12_4_ = auVar82._12_4_ + fVar66;
                auVar86._16_4_ = fVar67 + 0.0;
                auVar86._20_4_ = fVar68 + 0.0;
                auVar86._24_4_ = fVar69 + 0.0;
                auVar86._28_4_ = fVar89 + 0.0;
                auVar40 = vpminsd_avx2(auVar13,auVar81);
                auVar41 = vpminsd_avx2(auVar42,auVar83);
                auVar40 = vpmaxsd_avx2(auVar40,auVar41);
                auVar39 = vpminsd_avx2(auVar14,auVar86);
                auVar40 = vpmaxsd_avx2(auVar40,auVar39);
                auVar41 = vpmaxsd_avx2(auVar13,auVar81);
                auVar42 = vpmaxsd_avx2(auVar42,auVar83);
                auVar42 = vpminsd_avx2(auVar41,auVar42);
                auVar41 = vpmaxsd_avx2(auVar14,auVar86);
                auVar41 = vpminsd_avx2(auVar42,auVar41);
                auVar42 = vmulps_avx512vl(auVar40,auVar109._0_32_);
                auVar41 = vmulps_avx512vl(auVar41,auVar110._0_32_);
                auVar40 = vpmaxsd_avx2(auVar42,local_2800);
                auVar41 = vpminsd_avx2(auVar41,local_27e0);
              }
              auVar93 = ZEXT3264(auVar39);
              auVar88 = ZEXT3264(auVar86);
              uVar9 = vcmpps_avx512vl(auVar40,auVar41,2);
              uVar22 = uVar34;
              auVar45 = auVar44;
              if ((byte)uVar9 != 0) {
                auVar40 = vblendmps_avx512vl(auVar108._0_32_,auVar42);
                bVar25 = (bool)((byte)uVar9 & 1);
                auVar45._0_4_ = (uint)bVar25 * auVar40._0_4_ | (uint)!bVar25 * auVar42._0_4_;
                bVar25 = (bool)((byte)(uVar9 >> 1) & 1);
                auVar45._4_4_ = (uint)bVar25 * auVar40._4_4_ | (uint)!bVar25 * auVar42._4_4_;
                bVar25 = (bool)((byte)(uVar9 >> 2) & 1);
                auVar45._8_4_ = (uint)bVar25 * auVar40._8_4_ | (uint)!bVar25 * auVar42._8_4_;
                bVar25 = (bool)((byte)(uVar9 >> 3) & 1);
                auVar45._12_4_ = (uint)bVar25 * auVar40._12_4_ | (uint)!bVar25 * auVar42._12_4_;
                bVar25 = (bool)((byte)(uVar9 >> 4) & 1);
                auVar45._16_4_ = (uint)bVar25 * auVar40._16_4_ | (uint)!bVar25 * auVar42._16_4_;
                bVar25 = (bool)((byte)(uVar9 >> 5) & 1);
                auVar45._20_4_ = (uint)bVar25 * auVar40._20_4_ | (uint)!bVar25 * auVar42._20_4_;
                bVar25 = (bool)((byte)(uVar9 >> 6) & 1);
                auVar45._24_4_ = (uint)bVar25 * auVar40._24_4_ | (uint)!bVar25 * auVar42._24_4_;
                bVar25 = SUB81(uVar9 >> 7,0);
                auVar45._28_4_ = (uint)bVar25 * auVar40._28_4_ | (uint)!bVar25 * auVar42._28_4_;
                uVar22 = uVar35;
                if (uVar34 != 8) {
                  *puVar27 = uVar34;
                  puVar27 = puVar27 + 1;
                  *pauVar30 = auVar44;
                  pauVar30 = pauVar30 + 1;
                }
              }
              auVar44 = auVar45;
              uVar34 = uVar22;
            }
            if (uVar34 == 8) goto LAB_01d0f503;
            uVar8 = vcmpps_avx512vl(auVar44,local_27e0,9);
            root.ptr = uVar34;
          } while ((byte)uVar29 < (byte)POPCOUNT((int)uVar8));
          *puVar27 = uVar34;
          puVar27 = puVar27 + 1;
          *pauVar30 = auVar44;
          pauVar30 = pauVar30 + 1;
LAB_01d0f503:
          iVar36 = 4;
        }
        else {
          while (bVar24 = (byte)local_29e4, uVar34 != 0) {
            sVar1 = 0;
            for (uVar26 = uVar34; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
              sVar1 = sVar1 + 1;
            }
            uVar34 = uVar34 - 1 & uVar34;
            auVar88 = ZEXT1664(auVar88._0_16_);
            auVar93 = ZEXT1664(auVar93._0_16_);
            auVar94 = ZEXT1664(auVar94._0_16_);
            in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
            bVar25 = occluded1(This,bvh,root,sVar1,(Precalculations *)&local_27c0,ray,
                               (TravRayK<8,_true> *)&local_2980.field_0,context);
            bVar31 = (byte)(1 << ((uint)sVar1 & 0x1f));
            if (!bVar25) {
              bVar31 = 0;
            }
            local_29e4 = (uint)(bVar24 | bVar31);
          }
          iVar36 = 3;
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar105 = ZEXT3264(auVar40);
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
          auVar106 = ZEXT3264(auVar40);
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar107 = ZEXT3264(auVar40);
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar108 = ZEXT3264(auVar40);
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
          auVar109 = ZEXT3264(auVar40);
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar110 = ZEXT3264(auVar40);
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar112 = ZEXT3264(auVar40);
          auVar113 = ZEXT3264(auVar44);
          if (bVar24 != 0xff) {
            auVar44 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            local_27e0._0_4_ =
                 (uint)(bVar24 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar24 & 1) * local_27e0._0_4_;
            bVar25 = (bool)((byte)(local_29e4 >> 1) & 1);
            local_27e0._4_4_ = (uint)bVar25 * auVar44._4_4_ | (uint)!bVar25 * local_27e0._4_4_;
            bVar25 = (bool)((byte)(local_29e4 >> 2) & 1);
            local_27e0._8_4_ = (uint)bVar25 * auVar44._8_4_ | (uint)!bVar25 * local_27e0._8_4_;
            bVar25 = (bool)((byte)(local_29e4 >> 3) & 1);
            local_27e0._12_4_ = (uint)bVar25 * auVar44._12_4_ | (uint)!bVar25 * local_27e0._12_4_;
            bVar25 = (bool)((byte)(local_29e4 >> 4) & 1);
            local_27e0._16_4_ = (uint)bVar25 * auVar44._16_4_ | (uint)!bVar25 * local_27e0._16_4_;
            bVar25 = (bool)((byte)(local_29e4 >> 5) & 1);
            local_27e0._20_4_ = (uint)bVar25 * auVar44._20_4_ | (uint)!bVar25 * local_27e0._20_4_;
            bVar25 = (bool)((byte)(local_29e4 >> 6) & 1);
            local_27e0._24_4_ = (uint)bVar25 * auVar44._24_4_ | (uint)!bVar25 * local_27e0._24_4_;
            local_27e0._28_4_ =
                 (local_29e4 >> 7) * auVar44._28_4_ |
                 (uint)!SUB41(local_29e4 >> 7,0) * local_27e0._28_4_;
            iVar36 = 2;
          }
          if (uVar29 < (uint)POPCOUNT(uVar32)) goto LAB_01d0f1a5;
        }
        if (iVar36 == 3) {
LAB_01d0f763:
          local_29e4._0_1_ = (byte)local_29e4 & bVar33;
          bVar25 = (bool)((byte)local_29e4 >> 1 & 1);
          bVar3 = (bool)((byte)local_29e4 >> 2 & 1);
          bVar4 = (bool)((byte)local_29e4 >> 3 & 1);
          bVar5 = (bool)((byte)local_29e4 >> 4 & 1);
          bVar6 = (bool)((byte)local_29e4 >> 5 & 1);
          bVar7 = (bool)((byte)local_29e4 >> 6 & 1);
          *(uint *)(ray + 0x100) =
               (uint)((byte)local_29e4 & 1) * -0x800000 |
               (uint)!(bool)((byte)local_29e4 & 1) * *(int *)(ray + 0x100);
          *(uint *)(ray + 0x104) = (uint)bVar25 * -0x800000 | (uint)!bVar25 * *(int *)(ray + 0x104);
          *(uint *)(ray + 0x108) = (uint)bVar3 * -0x800000 | (uint)!bVar3 * *(int *)(ray + 0x108);
          *(uint *)(ray + 0x10c) = (uint)bVar4 * -0x800000 | (uint)!bVar4 * *(int *)(ray + 0x10c);
          *(uint *)(ray + 0x110) = (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(ray + 0x110);
          *(uint *)(ray + 0x114) = (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(ray + 0x114);
          *(uint *)(ray + 0x118) = (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(ray + 0x118);
          *(uint *)(ray + 0x11c) =
               (uint)((byte)local_29e4 >> 7) * -0x800000 |
               (uint)!(bool)((byte)local_29e4 >> 7) * *(int *)(ray + 0x11c);
          return;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }